

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_uint64
drwav_read_pcm_frames_f32__mulaw(drwav *pWav,drwav_uint64 framesToRead,float *pBufferOut)

{
  drwav_uint32 dVar1;
  drwav_uint64 dVar2;
  float *in_RDX;
  ulong in_RSI;
  drwav *in_RDI;
  drwav_uint64 framesRead;
  drwav_uint32 bytesPerFrame;
  drwav_uint8 sampleData [4096];
  drwav_uint64 totalFramesRead;
  void *in_stack_ffffffffffffefa8;
  drwav_uint8 local_1028 [4096];
  drwav_uint64 local_28;
  float *local_20;
  ulong local_18;
  drwav *local_10;
  drwav_uint64 local_8;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  dVar1 = drwav_get_bytes_per_pcm_frame(in_RDI);
  if (dVar1 == 0) {
    local_8 = 0;
  }
  else {
    local_28 = 0;
    for (; local_18 != 0; local_18 = local_18 - dVar2) {
      dVar2 = local_18;
      if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1000)) / ZEXT416(dVar1),0) <= local_18) {
        dVar2 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1000)) / ZEXT416(dVar1),0);
      }
      dVar2 = drwav_read_pcm_frames(local_10,dVar2,in_stack_ffffffffffffefa8);
      if (dVar2 == 0) break;
      drwav_mulaw_to_f32(local_20,local_1028,dVar2 * local_10->channels);
      local_20 = local_20 + dVar2 * local_10->channels;
      local_28 = dVar2 + local_28;
    }
    local_8 = local_28;
  }
  return local_8;
}

Assistant:

static drwav_uint64 drwav_read_pcm_frames_f32__mulaw(drwav* pWav, drwav_uint64 framesToRead, float* pBufferOut)
{
    drwav_uint64 totalFramesRead;
    drwav_uint8 sampleData[4096];

    drwav_uint32 bytesPerFrame = drwav_get_bytes_per_pcm_frame(pWav);
    if (bytesPerFrame == 0) {
        return 0;
    }

    totalFramesRead = 0;

    while (framesToRead > 0) {
        drwav_uint64 framesRead = drwav_read_pcm_frames(pWav, drwav_min(framesToRead, sizeof(sampleData)/bytesPerFrame), sampleData);
        if (framesRead == 0) {
            break;
        }

        drwav_mulaw_to_f32(pBufferOut, sampleData, (size_t)(framesRead*pWav->channels));

        pBufferOut      += framesRead*pWav->channels;
        framesToRead    -= framesRead;
        totalFramesRead += framesRead;
    }

    return totalFramesRead;
}